

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

void Super_WriteLibrary(Super_Man_t *pMan)

{
  int iVar1;
  char *__s;
  char *__ptr;
  FILE *__stream;
  bool bVar2;
  int local_40;
  int local_3c;
  int Counter;
  int i;
  char *pNameGeneric;
  char *FileName;
  FILE *pFile;
  Super_Gate_t_conflict *pGateNext;
  Super_Gate_t_conflict *pGate;
  Super_Man_t *pMan_local;
  
  __s = (char *)malloc(10000);
  __ptr = Extra_FileNameGeneric(pMan->pName);
  sprintf(__s,"%s.super_old",__ptr);
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  pMan->nUnique = 1;
  local_3c = 0;
  while( true ) {
    bVar2 = false;
    if (local_3c < pMan->nGates) {
      pGateNext = pMan->pGates[local_3c];
      bVar2 = pGateNext != (Super_Gate_t_conflict *)0x0;
    }
    if ((!bVar2) || (local_3c == pMan->nGates + -1)) break;
    if ((pMan->pGates[local_3c + 1]->uTruth[0] != pGateNext->uTruth[0]) ||
       (pMan->pGates[local_3c + 1]->uTruth[1] != pGateNext->uTruth[1])) {
      pMan->nUnique = pMan->nUnique + 1;
    }
    local_3c = local_3c + 1;
  }
  __stream = fopen(__s,"w");
  Super_WriteFileHeader(pMan,(FILE *)__stream);
  local_40 = 0;
  local_3c = 0;
  while( true ) {
    bVar2 = false;
    if (local_3c < pMan->nGates) {
      pGateNext = pMan->pGates[local_3c];
      bVar2 = pGateNext != (Super_Gate_t_conflict *)0x0;
    }
    if (!bVar2) break;
    local_40 = local_40 + 1;
    Super_WriteLibraryGate((FILE *)__stream,pMan,pGateNext,local_40);
    if (local_3c == pMan->nGates + -1) break;
    if ((pMan->pGates[local_3c + 1]->uTruth[0] != pGateNext->uTruth[0]) ||
       (pMan->pGates[local_3c + 1]->uTruth[1] != pGateNext->uTruth[1])) {
      fprintf(__stream,"\n");
    }
    local_3c = local_3c + 1;
  }
  if (local_40 != pMan->nGates) {
    __assert_fail("Counter == pMan->nGates",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                  ,0x500,"void Super_WriteLibrary(Super_Man_t *)");
  }
  fclose(__stream);
  if (pMan->fVerbose != 0) {
    printf("The supergates are written using old format \"%s\" ",__s);
    iVar1 = Extra_FileSize(__s);
    printf("(%0.3f MB).\n",(double)iVar1 / 1048576.0);
  }
  if (__s != (char *)0x0) {
    free(__s);
  }
  return;
}

Assistant:

void Super_WriteLibrary( Super_Man_t * pMan )
{
    Super_Gate_t * pGate, * pGateNext;
    FILE * pFile;
    char * FileName;
    char * pNameGeneric;
    int i, Counter;

    FileName = ABC_ALLOC( char, 10000 );

    // get the file name
    pNameGeneric = Extra_FileNameGeneric( pMan->pName );
    sprintf( FileName, "%s.super_old", pNameGeneric );
    ABC_FREE( pNameGeneric );

    // count the number of unique functions
    pMan->nUnique = 1;
    Super_ManForEachGate( pMan->pGates, pMan->nGates, i, pGate )
    {
        if ( i == pMan->nGates - 1 )
            break;
        // print the newline if this gate is different from the following one
        pGateNext = pMan->pGates[i+1];
        if ( pGateNext->uTruth[0] != pGate->uTruth[0] || pGateNext->uTruth[1] != pGate->uTruth[1] )
            pMan->nUnique++;
    }

    // start the file
    pFile = fopen( FileName, "w" );
    Super_WriteFileHeader( pMan, pFile );

    // print the gates
    Counter = 0;
    Super_ManForEachGate( pMan->pGates, pMan->nGates, i, pGate )
    {
        Super_WriteLibraryGate( pFile, pMan, pGate, ++Counter );
        if ( i == pMan->nGates - 1 )
            break;
        // print the newline if this gate is different from the following one
        pGateNext = pMan->pGates[i+1];
        if ( pGateNext->uTruth[0] != pGate->uTruth[0] || pGateNext->uTruth[1] != pGate->uTruth[1] )
            fprintf( pFile, "\n" );
    }
    assert( Counter == pMan->nGates );
    fclose( pFile );

    if ( pMan->fVerbose )
    {
        printf( "The supergates are written using old format \"%s\" ", FileName );
        printf( "(%0.3f MB).\n", ((double)Extra_FileSize(FileName))/(1<<20) );
    }

    ABC_FREE( FileName );
}